

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O3

void mzd_mul_v_parity_uint64_128_30(mzd_local_t *c,mzd_local_t *v,mzd_local_t *At)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  long unaff_R12;
  long unaff_R13;
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar22 [64];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = v->w64[0];
  auVar8 = vpbroadcastq_avx512f(auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = v->w64[1];
  auVar9 = vpbroadcastq_avx512f(auVar2);
  auVar10 = vpmovsxbq_avx512f(ZEXT816(0x8090a0b0c0d0e0f));
  auVar11 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar12 = vpbroadcastq_avx512f(ZEXT816(0xf));
  auVar13 = vpbroadcastq_avx512f(ZEXT816(2));
  auVar14 = vpbroadcastq_avx512f(ZEXT816(1));
  auVar15 = vpbroadcastq_avx512f(ZEXT816(0x40));
  auVar16 = vpbroadcastq_avx512f(ZEXT816(0xfffffffffffffff8));
  auVar24 = ZEXT1664((undefined1  [16])0x0);
  auVar17 = vpbroadcastq_avx512f();
  lVar6 = 0;
  do {
    auVar18 = vpbroadcastq_avx512f();
    auVar19 = vmovdqa64_avx512f(auVar24);
    auVar24 = vpsubq_avx512f(auVar12,auVar10);
    lVar6 = lVar6 + 8;
    auVar18 = vporq_avx512f(auVar18,auVar11);
    auVar24 = vpsllq_avx512f(auVar24,5);
    uVar5 = vpcmpuq_avx512f(auVar18,auVar12,1);
    vpaddq_avx512f(auVar17,auVar24);
    auVar24 = vpgatherqq_avx512f(*(undefined8 *)((long)At->w64 + unaff_R12));
    bVar3 = (byte)uVar5;
    auVar21._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar24._8_8_;
    auVar21._0_8_ = (ulong)(bVar3 & 1) * auVar24._0_8_;
    auVar21._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar24._16_8_;
    auVar21._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar24._24_8_;
    auVar21._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar24._32_8_;
    auVar21._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar24._40_8_;
    auVar21._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar24._48_8_;
    auVar21._56_8_ = (uVar5 >> 7) * auVar24._56_8_;
    auVar24 = vpgatherqq_avx512f(*(undefined8 *)(unaff_R13 + 8));
    auVar23._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar24._8_8_;
    auVar23._0_8_ = (ulong)(bVar3 & 1) * auVar24._0_8_;
    auVar23._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar24._16_8_;
    auVar23._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar24._24_8_;
    auVar23._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar24._32_8_;
    auVar23._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar24._40_8_;
    auVar23._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar24._48_8_;
    auVar23._56_8_ = (uVar5 >> 7) * auVar24._56_8_;
    auVar24 = vpgatherqq_avx512f(*(undefined8 *)(unaff_R13 + 0x18));
    auVar20._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar24._8_8_;
    auVar20._0_8_ = (ulong)(bVar3 & 1) * auVar24._0_8_;
    auVar20._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar24._16_8_;
    auVar20._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar24._24_8_;
    auVar20._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar24._32_8_;
    auVar20._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar24._40_8_;
    auVar20._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar24._48_8_;
    auVar20._56_8_ = (uVar5 >> 7) * auVar24._56_8_;
    auVar24 = vpandq_avx512f(auVar23,auVar9);
    auVar24 = vpternlogq_avx512f(auVar24,auVar21,auVar8,0x78);
    auVar21 = vpgatherqq_avx512f(*(undefined8 *)(unaff_R13 + 0x10));
    auVar22._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar21._8_8_;
    auVar22._0_8_ = (ulong)(bVar3 & 1) * auVar21._0_8_;
    auVar22._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar21._16_8_;
    auVar22._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar21._24_8_;
    auVar22._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar21._32_8_;
    auVar22._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar21._40_8_;
    auVar22._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar21._48_8_;
    auVar22._56_8_ = (uVar5 >> 7) * auVar21._56_8_;
    auVar21 = vpandq_avx512f(auVar20,auVar9);
    auVar24 = vpopcntq_avx512_vpopcntdq(auVar24);
    auVar21 = vpternlogq_avx512f(auVar21,auVar22,auVar8,0x78);
    auVar23 = vpaddq_avx512f(auVar10,auVar10);
    auVar10 = vpaddq_avx512f(auVar10,auVar16);
    auVar21 = vpopcntq_avx512_vpopcntdq(auVar21);
    auVar21 = vpaddq_avx512f(auVar21,auVar21);
    auVar21 = vpandq_avx512f(auVar21,auVar13);
    auVar24 = vpternlogq_avx512f(auVar21,auVar24,auVar14,0xf8);
    auVar21 = vpsubq_avx512f(auVar15,auVar23);
    auVar24 = vpsllvq_avx512f(auVar24,auVar21);
    auVar24 = vporq_avx512f(auVar24,auVar19);
  } while (lVar6 != 0x10);
  auVar8._8_8_ = 0xf;
  auVar8._0_8_ = 0xf;
  auVar8._16_8_ = 0xf;
  auVar8._24_8_ = 0xf;
  auVar8._32_8_ = 0xf;
  auVar8._40_8_ = 0xf;
  auVar8._48_8_ = 0xf;
  auVar8._56_8_ = 0xf;
  uVar5 = vpcmpuq_avx512f(auVar18,auVar8,1);
  c->w64[0] = 0;
  auVar8 = vmovdqa64_avx512f(auVar24);
  bVar4 = (bool)((byte)uVar5 & 1);
  auVar9._0_8_ = (ulong)bVar4 * auVar8._0_8_ | (ulong)!bVar4 * auVar19._0_8_;
  bVar4 = (bool)((byte)(uVar5 >> 1) & 1);
  auVar9._8_8_ = (ulong)bVar4 * auVar8._8_8_ | (ulong)!bVar4 * auVar19._8_8_;
  bVar4 = (bool)((byte)(uVar5 >> 2) & 1);
  auVar9._16_8_ = (ulong)bVar4 * auVar8._16_8_ | (ulong)!bVar4 * auVar19._16_8_;
  bVar4 = (bool)((byte)(uVar5 >> 3) & 1);
  auVar9._24_8_ = (ulong)bVar4 * auVar8._24_8_ | (ulong)!bVar4 * auVar19._24_8_;
  bVar4 = (bool)((byte)(uVar5 >> 4) & 1);
  auVar9._32_8_ = (ulong)bVar4 * auVar8._32_8_ | (ulong)!bVar4 * auVar19._32_8_;
  bVar4 = (bool)((byte)(uVar5 >> 5) & 1);
  auVar9._40_8_ = (ulong)bVar4 * auVar8._40_8_ | (ulong)!bVar4 * auVar19._40_8_;
  bVar4 = (bool)((byte)(uVar5 >> 6) & 1);
  auVar9._48_8_ = (ulong)bVar4 * auVar8._48_8_ | (ulong)!bVar4 * auVar19._48_8_;
  auVar9._56_8_ = (uVar5 >> 7) * auVar8._56_8_ | (ulong)!SUB81(uVar5 >> 7,0) * auVar19._56_8_;
  auVar7 = vextracti64x4_avx512f(auVar9,1);
  auVar8 = vporq_avx512f(auVar9,ZEXT3264(auVar7));
  auVar1 = vpor_avx(auVar8._0_16_,auVar8._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpor_avx(auVar1,auVar2);
  c->w64[1] = auVar1._0_8_;
  return;
}

Assistant:

void mzd_mul_v_parity_uint64_128_30(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* At) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* vblock = CONST_BLOCK(v, 0);

  word res = 0;
  for (unsigned int i = 15; i; --i) {
    const block_t* Ablock = CONST_BLOCK(At, 15 - i);
    const word parity1 =
        parity64_uint64((vblock->w64[0] & Ablock->w64[0]) ^ (vblock->w64[1] & Ablock->w64[1]));
    const word parity2 =
        parity64_uint64((vblock->w64[0] & Ablock->w64[2]) ^ (vblock->w64[1] & Ablock->w64[3]));
    res |= (parity1 | (parity2 << 1)) << (64 - (2 * i));
  }
  cblock->w64[0] = 0;
  cblock->w64[1] = res;
}